

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::ExpandVariablesCMP0019(cmMakefile *this)

{
  cmTarget *pcVar1;
  bool bVar2;
  byte bVar3;
  PolicyStatus PVar4;
  TargetType TVar5;
  char *pcVar6;
  pointer ppVar7;
  string *psVar8;
  reference pbVar9;
  pointer ppVar10;
  ostream *poVar11;
  PolicyID id;
  string local_508;
  string local_4e8 [32];
  string local_4c8;
  undefined1 local_4a8 [8];
  ostringstream m;
  string local_330 [32];
  undefined1 local_310 [8];
  string orig_1;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
  local_2e8;
  iterator l_1;
  string orig;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  iterator d;
  string local_2a8;
  allocator local_281;
  undefined1 local_280 [8];
  string dirs_1;
  string local_258;
  cmTarget *local_238;
  cmTarget *t;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_228;
  iterator l;
  string local_218;
  allocator local_1f1;
  undefined1 local_1f0 [8];
  string dirs;
  allocator local_1b9;
  string local_1b8;
  char *local_198;
  char *includeDirs;
  ostringstream w;
  PolicyStatus pol;
  cmMakefile *this_local;
  
  PVar4 = GetPolicyStatus(this,CMP0019);
  if ((PVar4 == OLD) || (PVar4 == WARN)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includeDirs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,"INCLUDE_DIRECTORIES",&local_1b9);
    pcVar6 = GetProperty(this,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    local_198 = pcVar6;
    bVar2 = mightExpandVariablesCMP0019(pcVar6);
    pcVar6 = local_198;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_1f0,pcVar6,&local_1f1);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      ExpandVariablesInString(this,(string *)local_1f0,true,true,false,(char *)0x0,-1,false,false);
      if ((PVar4 == WARN) &&
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1f0,local_198), bVar2)) {
        poVar11 = std::operator<<((ostream *)&includeDirs,
                                  "Evaluated directory INCLUDE_DIRECTORIES\n");
        poVar11 = std::operator<<(poVar11,"  ");
        poVar11 = std::operator<<(poVar11,local_198);
        poVar11 = std::operator<<(poVar11,"\n");
        poVar11 = std::operator<<(poVar11,"as\n");
        poVar11 = std::operator<<(poVar11,"  ");
        poVar11 = std::operator<<(poVar11,(string *)local_1f0);
        std::operator<<(poVar11,"\n");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_218,"INCLUDE_DIRECTORIES",
                 (allocator *)
                 ((long)&l.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                         ._M_cur + 7));
      pcVar6 = (char *)std::__cxx11::string::c_str();
      SetProperty(this,&local_218,pcVar6);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&l.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                         ._M_cur + 7));
      std::__cxx11::string::~string((string *)local_1f0);
    }
    local_228._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
         ::begin(&this->Targets);
    while( true ) {
      t = (cmTarget *)
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
          ::end(&this->Targets);
      bVar2 = std::__detail::operator!=
                        (&local_228,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                          *)&t);
      if (!bVar2) break;
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                             *)&local_228);
      local_238 = &ppVar7->second;
      TVar5 = cmTarget::GetType(local_238);
      pcVar1 = local_238;
      if (TVar5 != INTERFACE_LIBRARY) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_258,"INCLUDE_DIRECTORIES",
                   (allocator *)(dirs_1.field_2._M_local_buf + 0xf));
        local_198 = cmTarget::GetProperty(pcVar1,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator((allocator<char> *)(dirs_1.field_2._M_local_buf + 0xf));
        bVar2 = mightExpandVariablesCMP0019(local_198);
        pcVar6 = local_198;
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_280,pcVar6,&local_281);
          std::allocator<char>::~allocator((allocator<char> *)&local_281);
          ExpandVariablesInString
                    (this,(string *)local_280,true,true,false,(char *)0x0,-1,false,false);
          if ((PVar4 == WARN) &&
             (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_280,local_198), bVar2)) {
            poVar11 = std::operator<<((ostream *)&includeDirs,"Evaluated target ");
            psVar8 = cmTarget::GetName_abi_cxx11_(local_238);
            poVar11 = std::operator<<(poVar11,(string *)psVar8);
            poVar11 = std::operator<<(poVar11," INCLUDE_DIRECTORIES\n");
            poVar11 = std::operator<<(poVar11,"  ");
            poVar11 = std::operator<<(poVar11,local_198);
            poVar11 = std::operator<<(poVar11,"\n");
            poVar11 = std::operator<<(poVar11,"as\n");
            poVar11 = std::operator<<(poVar11,"  ");
            poVar11 = std::operator<<(poVar11,(string *)local_280);
            std::operator<<(poVar11,"\n");
          }
          pcVar1 = local_238;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_2a8,"INCLUDE_DIRECTORIES",
                     (allocator *)((long)&d._M_current + 7));
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmTarget::SetProperty(pcVar1,&local_2a8,pcVar6);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&d._M_current + 7));
          std::__cxx11::string::~string((string *)local_280);
        }
      }
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                    *)&local_228);
    }
    local_2b8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->LinkDirectories);
    while( true ) {
      orig.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->LinkDirectories);
      bVar2 = __gnu_cxx::operator!=
                        (&local_2b8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&orig.field_2 + 8));
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_2b8);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      bVar2 = mightExpandVariablesCMP0019(pcVar6);
      if (bVar2) {
        pbVar9 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_2b8);
        std::__cxx11::string::string((string *)&l_1,(string *)pbVar9);
        pbVar9 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_2b8);
        ExpandVariablesInString(this,pbVar9,true,true,false,(char *)0x0,-1,false,false);
        if (PVar4 == WARN) {
          pbVar9 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_2b8);
          bVar2 = std::operator!=(pbVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&l_1);
          if (bVar2) {
            poVar11 = std::operator<<((ostream *)&includeDirs,"Evaluated link directory\n");
            poVar11 = std::operator<<(poVar11,"  ");
            poVar11 = std::operator<<(poVar11,(string *)&l_1);
            poVar11 = std::operator<<(poVar11,"\n");
            poVar11 = std::operator<<(poVar11,"as\n");
            poVar11 = std::operator<<(poVar11,"  ");
            pbVar9 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_2b8);
            poVar11 = std::operator<<(poVar11,(string *)pbVar9);
            std::operator<<(poVar11,"\n");
          }
        }
        std::__cxx11::string::~string((string *)&l_1);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_2b8);
    }
    local_2e8._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
            ::begin(&this->LinkLibraries);
    while( true ) {
      orig_1.field_2._8_8_ =
           std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
           ::end(&this->LinkLibraries);
      bVar2 = __gnu_cxx::operator!=
                        (&local_2e8,
                         (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                          *)((long)&orig_1.field_2 + 8));
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
      ::operator->(&local_2e8);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      bVar2 = mightExpandVariablesCMP0019(pcVar6);
      if (bVar2) {
        ppVar10 = __gnu_cxx::
                  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                  ::operator->(&local_2e8);
        std::__cxx11::string::string((string *)local_310,(string *)ppVar10);
        ppVar10 = __gnu_cxx::
                  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                  ::operator->(&local_2e8);
        ExpandVariablesInString(this,&ppVar10->first,true,true,false,(char *)0x0,-1,false,false);
        if (PVar4 == WARN) {
          ppVar10 = __gnu_cxx::
                    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                    ::operator->(&local_2e8);
          bVar2 = std::operator!=(&ppVar10->first,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_310);
          if (bVar2) {
            poVar11 = std::operator<<((ostream *)&includeDirs,"Evaluated link library\n");
            poVar11 = std::operator<<(poVar11,"  ");
            poVar11 = std::operator<<(poVar11,(string *)local_310);
            poVar11 = std::operator<<(poVar11,"\n");
            poVar11 = std::operator<<(poVar11,"as\n");
            poVar11 = std::operator<<(poVar11,"  ");
            ppVar10 = __gnu_cxx::
                      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                      ::operator->(&local_2e8);
            poVar11 = std::operator<<(poVar11,(string *)ppVar10);
            std::operator<<(poVar11,"\n");
          }
        }
        std::__cxx11::string::~string((string *)local_310);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
      ::operator++(&local_2e8);
    }
    std::__cxx11::ostringstream::str();
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_330);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_4c8,(cmPolicies *)0x13,id);
      poVar11 = std::operator<<((ostream *)local_4a8,(string *)&local_4c8);
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"The following variable evaluations were encountered:\n");
      std::__cxx11::ostringstream::str();
      std::operator<<(poVar11,local_4e8);
      std::__cxx11::string::~string(local_4e8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includeDirs);
  }
  return;
}

Assistant:

void cmMakefile::ExpandVariablesCMP0019()
{
  // Drop this ancient compatibility behavior with a policy.
  cmPolicies::PolicyStatus pol = this->GetPolicyStatus(cmPolicies::CMP0019);
  if(pol != cmPolicies::OLD && pol != cmPolicies::WARN)
    {
    return;
    }
  std::ostringstream w;

  const char *includeDirs = this->GetProperty("INCLUDE_DIRECTORIES");
  if(mightExpandVariablesCMP0019(includeDirs))
    {
    std::string dirs = includeDirs;
    this->ExpandVariablesInString(dirs, true, true);
    if(pol == cmPolicies::WARN && dirs != includeDirs)
      {
      w << "Evaluated directory INCLUDE_DIRECTORIES\n"
        << "  " << includeDirs << "\n"
        << "as\n"
        << "  " << dirs << "\n";
      }
    this->SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
    }

  // Also for each target's INCLUDE_DIRECTORIES property:
  for (cmTargets::iterator l = this->Targets.begin();
       l != this->Targets.end(); ++l)
    {
    cmTarget &t = l->second;
    if (t.GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    includeDirs = t.GetProperty("INCLUDE_DIRECTORIES");
    if(mightExpandVariablesCMP0019(includeDirs))
      {
      std::string dirs = includeDirs;
      this->ExpandVariablesInString(dirs, true, true);
      if(pol == cmPolicies::WARN && dirs != includeDirs)
        {
        w << "Evaluated target " << t.GetName() << " INCLUDE_DIRECTORIES\n"
          << "  " << includeDirs << "\n"
          << "as\n"
          << "  " << dirs << "\n";
        }
      t.SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
      }
    }

  for(std::vector<std::string>::iterator d = this->LinkDirectories.begin();
      d != this->LinkDirectories.end(); ++d)
    {
    if(mightExpandVariablesCMP0019(d->c_str()))
      {
      std::string orig = *d;
      this->ExpandVariablesInString(*d, true, true);
      if(pol == cmPolicies::WARN && *d != orig)
        {
        w << "Evaluated link directory\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << *d << "\n";
        }
      }
    }
  for(cmTarget::LinkLibraryVectorType::iterator l =
        this->LinkLibraries.begin();
      l != this->LinkLibraries.end(); ++l)
    {
    if(mightExpandVariablesCMP0019(l->first.c_str()))
      {
      std::string orig = l->first;
      this->ExpandVariablesInString(l->first, true, true);
      if(pol == cmPolicies::WARN && l->first != orig)
        {
        w << "Evaluated link library\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << l->first << "\n";
        }
      }
    }

  if(!w.str().empty())
    {
    std::ostringstream m;
    m << cmPolicies::GetPolicyWarning(cmPolicies::CMP0019)
      << "\n"
      << "The following variable evaluations were encountered:\n"
      << w.str();
    this->IssueMessage(cmake::AUTHOR_WARNING, m.str());
    }
}